

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

void __thiscall RuntimeObjectSystem::~RuntimeObjectSystem(RuntimeObjectSystem *this)

{
  BuildTool *this_00;
  RuntimeObjectSystem *this_local;
  
  (this->super_IRuntimeObjectSystem).super_ITestBuildNotifier._vptr_ITestBuildNotifier =
       (_func_int **)&PTR__RuntimeObjectSystem_0013f800;
  (this->super_IFileChangeListener)._vptr_IFileChangeListener =
       (_func_int **)&PTR__RuntimeObjectSystem_0013f940;
  (**(code **)(*(long *)this->m_pFileChangeNotifier + 0x40))
            (this->m_pFileChangeNotifier,&this->super_IFileChangeListener);
  DeletePlatformImpl(this);
  if (this->m_pObjectFactorySystem != (IObjectFactorySystem *)0x0) {
    (*this->m_pObjectFactorySystem->_vptr_IObjectFactorySystem[0xd])();
  }
  if (this->m_pFileChangeNotifier != (IFileChangeNotifier *)0x0) {
    (**(code **)(*(long *)this->m_pFileChangeNotifier + 0x50))();
  }
  this_00 = this->m_pBuildTool;
  if (this_00 != (BuildTool *)0x0) {
    BuildTool::~BuildTool(this_00);
    operator_delete(this_00,0x18);
  }
  std::
  map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
  ::~map(&this->m_FoundSourceDirectoryMappings);
  std::
  vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
  ::~vector(&this->m_Projects);
  FileSystemUtils::Path::~Path(&this->m_CurrentlyCompilingModuleName);
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&this->m_Modules);
  std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector
            (&this->linkLibraryList);
  IFileChangeListener::~IFileChangeListener(&this->super_IFileChangeListener);
  IRuntimeObjectSystem::~IRuntimeObjectSystem(&this->super_IRuntimeObjectSystem);
  return;
}

Assistant:

RuntimeObjectSystem::~RuntimeObjectSystem()
{
	m_pFileChangeNotifier->RemoveListener(this);
    DeletePlatformImpl();
	delete m_pObjectFactorySystem;
	delete m_pFileChangeNotifier;
	delete m_pBuildTool;

	// Note we do not delete compiler logger, creator should do this
}